

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupReplaceCut(Gia_Man_t *p)

{
  uint uVar1;
  Gia_Man_t *p_00;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  
  Gia_ManHighLightFlopLogic(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar2;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  for (iVar6 = 0; iVar6 < p->nObjs; iVar6 = iVar6 + 1) {
    pGVar3 = Gia_ManObj(p,iVar6);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    uVar4 = *(ulong *)pGVar3;
    uVar5 = uVar4 & 0x1fffffff;
    if (((uint)uVar4 & 0xc0000000) == 0x40000000 && uVar5 != 0x1fffffff) {
      if (((pGVar3[-uVar5].field_0x3 & 0x40) == 0) && (pGVar3[-uVar5].Value == 0xffffffff)) {
        uVar1 = Gia_ManAppendCi(p_00);
        pGVar3[-uVar5].Value = uVar1;
        uVar4 = *(ulong *)pGVar3;
      }
      uVar4 = (ulong)((uint)(uVar4 >> 0x20) & 0x1fffffff);
      if (((pGVar3[-uVar4].field_0x3 & 0x40) == 0) && (pGVar3[-uVar4].Value == 0xffffffff)) {
        uVar1 = Gia_ManAppendCi(p_00);
        pGVar3[-uVar4].Value = uVar1;
      }
    }
  }
  for (iVar6 = 0; iVar6 < p->nRegs; iVar6 = iVar6 + 1) {
    pGVar3 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar6);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar3->Value = uVar1;
  }
  for (iVar6 = 0; iVar6 < p->vCos->nSize; iVar6 = iVar6 + 1) {
    pGVar3 = Gia_ManCo(p,iVar6);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    Gia_ManDupOrderDfs_rec(p_00,p,pGVar3);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  Gia_ManCleanMark0(p);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupReplaceCut( Gia_Man_t * p )
{
    Gia_Man_t * pNew;  int i;
    Gia_Obj_t * pObj, * pFanin;
    Gia_ManHighLightFlopLogic( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create PIs for nodes pointed to from above the cut
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !pObj->fMark0 )
            continue;
        pFanin = Gia_ObjFanin0(pObj);
        if ( !pFanin->fMark0 && !~pFanin->Value )
            pFanin->Value = Gia_ManAppendCi(pNew);
        pFanin = Gia_ObjFanin1(pObj);
        if ( !pFanin->fMark0 && !~pFanin->Value )
            pFanin->Value = Gia_ManAppendCi(pNew);
    }
    // create flop outputs
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create internal nodes
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManDupOrderDfs_rec( pNew, p, pObj );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Gia_ManCleanMark0( p );
    return pNew;
}